

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_utils_leb128.c
# Opt level: O1

size_t lj_utils_write_uleb128(uint8_t *buffer,uint64_t value)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = 0;
  uVar3 = value;
  if (0x7f < value) {
    do {
      buffer[lVar2] = (byte)uVar3 | 0x80;
      lVar2 = lVar2 + 1;
      value = uVar3 >> 7;
      bVar1 = 0x3fff < uVar3;
      uVar3 = value;
    } while (bVar1);
  }
  buffer[lVar2] = (uint8_t)value;
  return lVar2 + 1;
}

Assistant:

size_t LJ_FASTCALL lj_utils_write_uleb128(uint8_t *buffer, uint64_t value)
{
  size_t i = 0;

  for (; value >= MIN_TWOBYTE_VALUE; value >>= SHIFT_STEP)
    buffer[i++] = (uint8_t)((value & PAYLOAD_MASK) | LINK_BIT);

  buffer[i++] = (uint8_t)value;

  lj_assertX(i <= LEB128_U64_MAXSIZE, "bad uleb128 size");

  return i;
}